

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O1

void __thiscall
ncnn::DeformableConv2D_x86_avx::DeformableConv2D_x86_avx(DeformableConv2D_x86_avx *this)

{
  DeformableConv2D::DeformableConv2D(&this->super_DeformableConv2D);
  (this->super_DeformableConv2D).super_Layer._vptr_Layer =
       (_func_int **)&PTR__DeformableConv2D_x86_avx_00659330;
  (this->weight_data_tm).cstep = 0;
  this->gemm = (Layer *)0x0;
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->super_DeformableConv2D).super_Layer.support_packing = true;
  this->activation = (Layer *)0x0;
  return;
}

Assistant:

DeformableConv2D_x86_avx::DeformableConv2D_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}